

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int llhttp__before_headers_complete(llhttp_t *parser,char *p,char *endp)

{
  bool bVar1;
  
  if ((~parser->flags & 0x14) == 0) {
    bVar1 = true;
    if (parser->type != '\x01') {
      bVar1 = parser->status_code == 0x65;
    }
  }
  else {
    bVar1 = parser->method == '\x05';
  }
  parser->upgrade = bVar1;
  return 0;
}

Assistant:

int llhttp__before_headers_complete(llhttp_t* parser, const char* p,
                                    const char* endp) {
  /* Set this here so that on_headers_complete() callbacks can see it */
  if ((parser->flags & F_UPGRADE) &&
      (parser->flags & F_CONNECTION_UPGRADE)) {
    /* For responses, "Upgrade: foo" and "Connection: upgrade" are
     * mandatory only when it is a 101 Switching Protocols response,
     * otherwise it is purely informational, to announce support.
     */
    parser->upgrade =
        (parser->type == HTTP_REQUEST || parser->status_code == 101);
  } else {
    parser->upgrade = (parser->method == HTTP_CONNECT);
  }
  return 0;
}